

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_METAL_CRS(Context *ctx)

{
  size_t in_RCX;
  char src1 [64];
  char src0 [64];
  char code [128];
  
  make_METAL_srcarg_string_vec3(ctx,0,src0,in_RCX);
  make_METAL_srcarg_string_vec3(ctx,1,src1,in_RCX);
  ctx->metal_need_header_geometric = 1;
  make_METAL_destarg_assign(ctx,code,0x80,"cross(%s, %s)",src0,src1);
  output_line(ctx,"%s",code);
  return;
}

Assistant:

static void emit_METAL_CRS(Context *ctx)
{
    // !!! FIXME: needs to take ctx->dst_arg.writemask into account.
    char src0[64]; make_METAL_srcarg_string_vec3(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_METAL_srcarg_string_vec3(ctx, 1, src1, sizeof (src1));
    char code[128];
    ctx->metal_need_header_geometric = 1;
    make_METAL_destarg_assign(ctx, code, sizeof (code),
                             "cross(%s, %s)", src0, src1);
    output_line(ctx, "%s", code);
}